

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O1

list_elem * list_pop_back(list *list)

{
  list_elem *plVar1;
  list_elem *plVar2;
  list_elem *plVar3;
  
  plVar1 = list->tail;
  if (plVar1 != (list_elem *)0x0) {
    plVar2 = plVar1->next;
    if (plVar2 != (list_elem *)0x0) {
      plVar2->prev = plVar1->prev;
    }
    plVar3 = plVar1->prev;
    if (plVar3 != (list_elem *)0x0) {
      plVar3->next = plVar2;
    }
    if (list->head == plVar1) {
      list->head = plVar1->next;
    }
    list->tail = plVar3;
    return plVar1;
  }
  return (list_elem *)0x0;
}

Assistant:

struct list_elem *list_pop_back(struct list *list)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    struct list_elem *e = list->tail;
    if (e) {
        // if not NULL
        if (e->next) e->next->prev = e->prev;
        if (e->prev) e->prev->next = e->next;

        if (list->head == e) list->head = e->next;
        if (list->tail == e) list->tail = e->prev;

        IFDEF_LOCK( spin_unlock(&list->lock); );
        return e;
    }
    // NULL .. do nothing
    IFDEF_LOCK( spin_unlock(&list->lock); );
    return NULL;
}